

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_odc.c
# Opt level: O0

void test_read_format_cpio_odc(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a_00;
  archive *a;
  archive_entry *ae;
  
  a_00 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L'4',(uint)(a_00 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L'5',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L'6',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  iVar1 = archive_read_open_memory(a_00,archive,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L'7',(uint)(iVar1 == 0),
                   "0 == archive_read_open_memory(a, archive, sizeof(archive))",a_00);
  iVar1 = archive_read_next_header(a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                      ,L'8',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_filter_code(a_00,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L'9',(uint)(iVar1 == 0),"archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE",a_00)
  ;
  iVar1 = archive_format(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                   ,L':',(uint)(iVar1 == 0x10001),"archive_format(a) == ARCHIVE_FORMAT_CPIO_POSIX",
                   a_00);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                      ,L';',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                      ,L'<',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_close(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_cpio_odc.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_odc)
{
	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_CPIO_POSIX);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}